

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_eigenmath.h
# Opt level: O0

void __thiscall
SpatialVector_t::SpatialVector_t
          (SpatialVector_t *this,double *v0,double *v1,double *v2,double *v3,double *v4,double *v5)

{
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *s;
  Scalar *in_stack_ffffffffffffff70;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffff78;
  CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_ffffffffffffff80;
  
  Eigen::Matrix<double,_6,_1,_0,_6,_1>::Matrix((Matrix<double,_6,_1,_0,_6,_1> *)0x123448);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::_check_template_params();
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator<<
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
            (in_stack_ffffffffffffff80,(Scalar *)in_stack_ffffffffffffff78);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                      (in_stack_ffffffffffffff80,(Scalar *)in_stack_ffffffffffffff78);
  s = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_
                (this_00,(Scalar *)in_stack_ffffffffffffff78);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_(this_00,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::operator_(this_00,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)0x1234e2);
  return;
}

Assistant:

EIGEN_STRONG_INLINE SpatialVector_t(
				const double& v0, const double& v1, const double& v2,
				const double& v3, const double& v4, const double& v5
				)
		{
			Base::_check_template_params();

			(*this) << v0, v1, v2, v3, v4, v5;
		}